

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void __thiscall testing::internal::Arguments::AddArgument(Arguments *this,char *argument)

{
  char *local_38;
  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> local_30;
  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> local_28;
  const_iterator local_20;
  char *local_18;
  char *argument_local;
  Arguments *this_local;
  
  local_18 = argument;
  argument_local = (char *)this;
  local_30._M_current = (char **)std::vector<char_*,_std::allocator<char_*>_>::end(&this->args_);
  local_28 = __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
             operator-(&local_30,1);
  __gnu_cxx::__normal_iterator<char*const*,std::vector<char*,std::allocator<char*>>>::
  __normal_iterator<char**>
            ((__normal_iterator<char*const*,std::vector<char*,std::allocator<char*>>> *)&local_20,
             &local_28);
  local_38 = posix::StrDup(local_18);
  std::vector<char_*,_std::allocator<char_*>_>::insert(&this->args_,local_20,&local_38);
  return;
}

Assistant:

void AddArgument(const char* argument) {
    args_.insert(args_.end() - 1, posix::StrDup(argument));
  }